

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

bool dgrminer::is_min_code
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges)

{
  pointer *ppaVar1;
  pointer *ppaVar2;
  vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *this;
  vector<int,std::allocator<int>> *this_00;
  array<int,_10UL> *pattern_edge1;
  undefined4 *puVar3;
  undefined8 uVar4;
  mapped_type mVar5;
  iterator iVar6;
  pointer paVar7;
  iterator __position;
  iterator __position_00;
  byte bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  iterator __last;
  size_type __n;
  bool bVar12;
  mapped_type *pmVar13;
  pointer paVar14;
  _Map_pointer ppiVar15;
  int *piVar16;
  _Elt_pointer piVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  _Bit_type *p_Var21;
  _Elt_pointer piVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  _Bit_type *p_Var26;
  pointer pvVar27;
  ulong uVar28;
  int iVar29;
  key_type *__k;
  ulong uVar30;
  _Map_pointer ppiVar31;
  pointer piVar32;
  ulong uVar33;
  _Elt_pointer piVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  array<int,_10UL> *paVar39;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  _Var40;
  array<int,_10UL> newedge;
  vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
  edge_candidates;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> built_min_code;
  vector<int,_std::allocator<int>_> dst_vertices;
  vector<int,_std::allocator<int>_> src_vertices;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_edge_candidates_selected_edges_ind;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  amount_of_usage_of_original_vertices;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  all_edge_candidates;
  deque<int,_std::allocator<int>_> right_most_path_occurrence;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> vertex_id_mapping;
  array<int,_10UL> built_min_code_edge;
  vector<int,_std::allocator<int>_> selected_edges_ind;
  vector<int,_std::allocator<int>_> selected_candidates;
  vector<int,_std::allocator<int>_> indices_of_min_edges;
  _Deque_base<int,_std::allocator<int>_> local_2e8;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  local_298;
  iterator iStack_290;
  labeled_pattern_edge *local_288;
  int local_27c;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_278;
  vector<bool,_std::allocator<bool>_> local_260;
  ulong local_238;
  long local_230;
  void *local_228;
  iterator iStack_220;
  int *local_218;
  void *local_208;
  iterator iStack_200;
  int *local_1f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1f0;
  labeled_pattern_edge local_1d4;
  size_type local_1a8;
  pointer local_1a0;
  long local_198;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_190;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  local_160;
  _Deque_base<int,_std::allocator<int>_> local_148;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_f0;
  array<int,_10UL> local_c0;
  size_type local_98;
  int *local_90;
  int *local_88;
  pointer local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar11 = (int)((long)(edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar18 = iVar11 * -0x33333333;
  if (0 < (int)uVar18) {
    uVar28 = (ulong)(uVar18 & 0x7fffffff);
    lVar36 = 0x24;
    do {
      paVar14 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)paVar14->_M_elems + lVar36 + -0x24);
      local_2e8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)CONCAT44((int)uVar4,(int)((ulong)uVar4 >> 0x20));
      local_2e8._M_impl.super__Deque_impl_data._M_map_size =
           *(size_t *)((long)paVar14->_M_elems + lVar36 + -8);
      iVar29 = *(int *)((long)paVar14->_M_elems + lVar36 + -0x14);
      if (iVar29 == 1) {
        iVar29 = 2;
      }
      else if (iVar29 == 2) {
        iVar29 = 1;
      }
      uVar4 = *(undefined8 *)((long)paVar14->_M_elems + lVar36 + -0x1c);
      puVar3 = (undefined4 *)((long)paVar14->_M_elems + lVar36 + -0x10);
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ = puVar3[1];
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ = (undefined4)uVar4;
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_ =
           (undefined4)((ulong)uVar4 >> 0x20);
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)CONCAT44(*puVar3,iVar29);
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ =
           *(undefined4 *)((long)paVar14->_M_elems + lVar36);
      iVar6._M_current =
           (edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (edge_list->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
        _M_realloc_insert<std::array<int,10ul>>
                  ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)edge_list,
                   iVar6,(array<int,_10UL> *)&local_2e8);
      }
      else {
        *(ulong *)((iVar6._M_current)->_M_elems + 8) =
             CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                      local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_);
        *(_Elt_pointer *)((iVar6._M_current)->_M_elems + 4) =
             local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        *(ulong *)((iVar6._M_current)->_M_elems + 6) =
             CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                      local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_);
        *(_Map_pointer *)(iVar6._M_current)->_M_elems =
             local_2e8._M_impl.super__Deque_impl_data._M_map;
        *(size_t *)((iVar6._M_current)->_M_elems + 2) =
             local_2e8._M_impl.super__Deque_impl_data._M_map_size;
        ppaVar1 = &(edge_list->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      lVar36 = lVar36 + 0x28;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  uVar19 = (uint)((ulong)((long)(starting_edges->
                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(starting_edges->
                               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar19) {
    uVar28 = (ulong)(uVar19 & 0x7fffffff);
    lVar36 = 0x1c;
    do {
      paVar7 = (starting_edges->
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_2e8._M_impl.super__Deque_impl_data._M_map =
           *(_Map_pointer *)((long)paVar7->_M_elems + lVar36 + -8);
      iVar29 = *(int *)((long)paVar7->_M_elems + lVar36 + -0x14);
      if (iVar29 == 1) {
        iVar29 = 2;
      }
      else if (iVar29 == 2) {
        iVar29 = 1;
      }
      uVar4 = *(undefined8 *)((long)paVar7->_M_elems + lVar36 + -0x1c);
      puVar3 = (undefined4 *)((long)paVar7->_M_elems + lVar36 + -0x10);
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ =
           (undefined4)((ulong)uVar4 >> 0x20);
      local_2e8._M_impl.super__Deque_impl_data._M_map_size = CONCAT44(*puVar3,iVar29);
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)CONCAT44((int)uVar4,puVar3[1]);
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ =
           *(undefined4 *)((long)paVar7->_M_elems + lVar36);
      __position._M_current =
           (starting_edges->
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (starting_edges->
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
        _M_realloc_insert<std::array<int,8ul>>
                  ((vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)starting_edges
                   ,__position,(array<int,_8UL> *)&local_2e8);
      }
      else {
        *(_Elt_pointer *)((__position._M_current)->_M_elems + 4) =
             local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        *(ulong *)((__position._M_current)->_M_elems + 6) =
             CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                      local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_);
        *(_Map_pointer *)(__position._M_current)->_M_elems =
             local_2e8._M_impl.super__Deque_impl_data._M_map;
        *(size_t *)((__position._M_current)->_M_elems + 2) =
             local_2e8._M_impl.super__Deque_impl_data._M_map_size;
        ppaVar2 = &(starting_edges->
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      lVar36 = lVar36 + 0x20;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  find_minimum_labelings(&local_48,edge_list,starting_edges,false);
  local_90 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar12 = true;
  }
  else {
    iVar11 = iVar11 * -0x66666666;
    local_98 = (size_type)iVar11;
    local_1a8 = (size_type)(int)uVar18;
    local_238 = 0x800000000000003f;
    piVar32 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    do {
      iVar29 = *piVar32;
      local_c0._M_elems[0] = 0;
      local_c0._M_elems[1] = 1;
      uVar28 = (ulong)iVar29;
      paVar39 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_c0._M_elems[2] = paVar39[uVar28]._M_elems[2];
      local_c0._M_elems[3] = paVar39[uVar28]._M_elems[3];
      local_c0._M_elems[4] = paVar39[uVar28]._M_elems[4];
      local_c0._M_elems[5] = paVar39[uVar28]._M_elems[5];
      local_c0._M_elems[6] = paVar39[uVar28]._M_elems[6];
      local_c0._M_elems[7] = paVar39[uVar28]._M_elems[7];
      local_c0._M_elems[8] = paVar39[uVar28]._M_elems[8];
      local_c0._M_elems[9] = paVar39[uVar28]._M_elems[9];
      local_88 = piVar32;
      bVar12 = is_pattern_edge_smaller_than(&local_c0,paVar39,true);
      if (bVar12) {
        bVar12 = false;
        break;
      }
      local_278.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (array<int,_10UL> *)0x0;
      local_278.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (array<int,_10UL> *)0x0;
      std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
      _M_realloc_insert<std::array<int,10ul>const&>
                ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)&local_278,
                 (iterator)0x0,&local_c0);
      local_2e8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((ulong)local_2e8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_260,local_98,(bool *)&local_2e8,(allocator_type *)&local_148);
      __n = local_1a8;
      local_2e8._M_impl.super__Deque_impl_data._M_map._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,local_1a8,(value_type_conflict1 *)&local_2e8,(allocator_type *)&local_148
                );
      local_2e8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)((ulong)local_2e8._M_impl.super__Deque_impl_data._M_map._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,__n,(value_type_conflict1 *)&local_2e8,(allocator_type *)&local_148);
      local_2e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_2e8._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      std::
      vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
      ::vector(&local_160,__n,(value_type *)&local_2e8,(allocator_type *)&local_148);
      if (local_2e8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
        operator_delete(local_2e8._M_impl.super__Deque_impl_data._M_map);
      }
      local_2e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_2e8._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_1f0,local_1a8,(value_type *)&local_2e8,(allocator_type *)&local_148);
      if (local_2e8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
        operator_delete(local_2e8._M_impl.super__Deque_impl_data._M_map);
      }
      *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = iVar29;
      iVar23 = iVar29 + 0x3f;
      if (-1 < iVar29) {
        iVar23 = iVar29;
      }
      local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p
      [(long)(iVar23 >> 6) + ((ulong)((uVar28 & local_238) < 0x8000000000000001) - 1)] =
           local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar23 >> 6) + ((ulong)((uVar28 & local_238) < 0x8000000000000001) - 1)] |
           1L << ((byte)iVar29 & 0x3f);
      lVar36 = (long)(int)(uVar18 + iVar29) % (long)iVar11;
      iVar23 = (int)lVar36;
      iVar29 = iVar23 + 0x3f;
      if (-1 < iVar23) {
        iVar29 = iVar23;
      }
      local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p
      [(long)(iVar29 >> 6) + ((ulong)(((long)iVar23 & local_238) < 0x8000000000000001) - 1)] =
           local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar29 >> 6) + ((ulong)(((long)iVar23 & local_238) < 0x8000000000000001) - 1)] |
           1L << ((byte)lVar36 & 0x3f);
      local_1f8 = (int *)0x0;
      local_208 = (void *)0x0;
      iStack_200._M_current = (int *)0x0;
      local_218 = (int *)0x0;
      local_228 = (void *)0x0;
      iStack_220._M_current = (int *)0x0;
      local_190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_190._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_190._M_impl.super__Rb_tree_header._M_header;
      local_190._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_f0._M_impl.super__Rb_tree_header._M_header;
      local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
      mVar5 = (edge_list->
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar28]._M_elems[0];
      local_2e8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((ulong)local_2e8._M_impl.super__Deque_impl_data._M_map & 0xffffffff00000000);
      local_190._M_impl.super__Rb_tree_header._M_header._M_right =
           local_190._M_impl.super__Rb_tree_header._M_header._M_left;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_f0,(key_type *)&local_2e8);
      *pmVar13 = mVar5;
      mVar5 = (edge_list->
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar28]._M_elems[1];
      local_2e8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_map._4_4_,1);
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_f0,(key_type *)&local_2e8);
      *pmVar13 = mVar5;
      paVar14 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((edge_list->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_finish != paVar14) {
        lVar36 = 4;
        uVar37 = 0;
        do {
          piVar16 = (int *)((long)paVar14->_M_elems + lVar36 + -4);
          if (iStack_200._M_current == local_1f8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_208,iStack_200,piVar16);
            paVar14 = (edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *iStack_200._M_current = *piVar16;
            iStack_200._M_current = iStack_200._M_current + 1;
          }
          piVar16 = (int *)((long)paVar14->_M_elems + lVar36);
          if (iStack_220._M_current == local_218) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_228,iStack_220,piVar16);
            paVar14 = (edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *iStack_220._M_current = *piVar16;
            iStack_220._M_current = iStack_220._M_current + 1;
          }
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_190,(key_type *)((long)paVar14->_M_elems + lVar36 + -4));
          *pmVar13 = 0;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_190,
                                 (key_type *)
                                 ((long)((edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar36));
          *pmVar13 = 0;
          uVar37 = uVar37 + 1;
          paVar14 = (edge_list->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar20 = ((long)(edge_list->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)paVar14 >> 3) *
                   -0x3333333333333333;
          lVar36 = lVar36 + 0x28;
        } while (uVar37 <= uVar20 && uVar20 - uVar37 != 0);
      }
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_190,paVar14[uVar28]._M_elems);
      *pmVar13 = 1;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_190,
                           (edge_list->
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar28]._M_elems + 1);
      *pmVar13 = 1;
      if (1 < (int)uVar18) {
        iVar29 = 1;
        do {
          lVar36 = (long)iVar29;
          iVar23 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar36];
          local_27c = iVar29;
          if (iVar23 == 0) {
            find_rightmost_path((deque<int,_std::allocator<int>_> *)&local_2e8,&local_278);
            local_148._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_finish._M_cur = (mapped_type *)0x0;
            local_148._M_impl.super__Deque_impl_data._M_finish._M_first = (mapped_type *)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_map_size = 0;
            std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_148,0);
            lVar38 = 0;
            uVar28 = 0;
            while( true ) {
              uVar37 = (ulong)((long)local_2e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                              (long)local_2e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3;
              lVar35 = CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_);
              lVar25 = (lVar35 - (long)local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2
                       ) + ((long)local_2e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_2e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2);
              if (((uVar37 - 1) +
                  (ulong)(local_2e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                         (_Map_pointer)0x0)) * 0x80 + lVar25 <= uVar28) break;
              uVar37 = ((long)local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur -
                        CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                                 local_2e8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_)
                       >> 2) + uVar28;
              if ((long)uVar37 < 0) {
                uVar20 = (long)uVar37 >> 7;
LAB_00120ab8:
                __k = local_2e8._M_impl.super__Deque_impl_data._M_start._M_node[uVar20] +
                      uVar37 + uVar20 * -0x80;
              }
              else {
                if (0x7f < uVar37) {
                  uVar20 = uVar37 >> 7;
                  goto LAB_00120ab8;
                }
                __k = (key_type *)
                      ((long)local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur + lVar38);
              }
              pmVar13 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_f0,__k);
              if (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_148._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_148,pmVar13);
              }
              else {
                *local_148._M_impl.super__Deque_impl_data._M_finish._M_cur = *pmVar13;
                local_148._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_148._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              uVar28 = uVar28 + 1;
              lVar38 = lVar38 + 4;
            }
            piVar17 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_148._M_impl.super__Deque_impl_data._M_finish._M_first) {
              piVar17 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            iVar29 = piVar17[-1];
            local_298._M_current = (labeled_pattern_edge *)0x0;
            iStack_290._M_current = (labeled_pattern_edge *)0x0;
            local_288 = (labeled_pattern_edge *)0x0;
            lVar25 = ((uVar37 - 1) +
                     (ulong)(local_2e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x80 + lVar25;
            if (lVar25 != 1) {
              uVar28 = 0;
              ppiVar15 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_node;
              ppiVar31 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_node;
              piVar17 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur;
              piVar22 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              piVar34 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_first;
              do {
                uVar37 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur -
                          (long)local_148._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                         uVar28;
                if ((long)uVar37 < 0) {
                  uVar20 = (long)uVar37 >> 7;
LAB_00120bbb:
                  piVar16 = local_148._M_impl.super__Deque_impl_data._M_start._M_node[uVar20] +
                            uVar37 + uVar20 * -0x80;
                }
                else {
                  if (0x7f < uVar37) {
                    uVar20 = uVar37 >> 7;
                    goto LAB_00120bbb;
                  }
                  piVar16 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur + uVar28;
                }
                uVar37 = (ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset;
                if (((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    uVar37 != 0) {
                  iVar23 = *piVar16;
                  lVar38 = 6;
                  uVar20 = 0;
                  p_Var21 = local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  p_Var26 = local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
                  do {
                    iVar24 = (int)uVar20;
                    if ((((p_Var21[uVar20 >> 6 & 0x3ffffff] >> (uVar20 & 0x3f) & 1) == 0) &&
                        (*(int *)((long)local_208 + uVar20 * 4) == iVar29)) &&
                       (*(int *)((long)local_228 + uVar20 * 4) == iVar23)) {
                      piVar17 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (local_2e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_2e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        piVar17 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                  0x80;
                      }
                      uVar30 = ((long)local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur -
                                CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_first.
                                         _4_4_,local_2e8._M_impl.super__Deque_impl_data._M_start.
                                               _M_first._0_4_) >> 2) + uVar28;
                      if ((long)uVar30 < 0) {
                        uVar33 = (long)uVar30 >> 7;
LAB_00120c92:
                        piVar16 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_node[uVar33]
                                  + uVar30 + uVar33 * -0x80;
                      }
                      else {
                        if (0x7f < uVar30) {
                          uVar33 = uVar30 >> 7;
                          goto LAB_00120c92;
                        }
                        piVar16 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar28;
                      }
                      local_1d4.elements._M_elems[0] = piVar17[-1];
                      local_1d4.elements._M_elems[1] = *piVar16;
                      paVar14 = (edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      piVar16 = paVar14->_M_elems + lVar38 + -4;
                      local_1d4.elements._M_elems._8_8_ = *(undefined8 *)piVar16;
                      local_1d4.elements._M_elems._16_8_ = *(undefined8 *)(piVar16 + 2);
                      piVar16 = paVar14->_M_elems + lVar38;
                      uVar4 = *(undefined8 *)piVar16;
                      uVar9 = *(undefined8 *)(piVar16 + 2);
                      local_1d4.elements._M_elems[6] = (int)uVar4;
                      local_1d4.elements._M_elems[7] = (int)((ulong)uVar4 >> 0x20);
                      local_1d4.elements._M_elems[8] = (int)uVar9;
                      local_1d4.elements._M_elems[9] = (int)((ulong)uVar9 >> 0x20);
                      local_1d4.index = iVar24;
                      if (iStack_290._M_current == local_288) {
                        std::
                        vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                        ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                  ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                    *)&local_298,iStack_290,&local_1d4);
                        uVar37 = (ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_finish.super__Bit_iterator_base
                                        ._M_offset;
                        p_Var21 = local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                        p_Var26 = local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
                      }
                      else {
                        *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 7) =
                             CONCAT44(local_1d4.elements._M_elems[8],local_1d4.elements._M_elems[7])
                        ;
                        *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 9) =
                             CONCAT44(iVar24,local_1d4.elements._M_elems[9]);
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 4) =
                             local_1d4.elements._M_elems._16_8_;
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 6) = uVar4;
                        *(ulong *)((iStack_290._M_current)->elements)._M_elems =
                             CONCAT44(local_1d4.elements._M_elems[1],local_1d4.elements._M_elems[0])
                        ;
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 2) =
                             local_1d4.elements._M_elems._8_8_;
                        iStack_290._M_current = iStack_290._M_current + 1;
                      }
                    }
                    uVar20 = uVar20 + 1;
                    lVar38 = lVar38 + 10;
                  } while (uVar20 < uVar37 + ((long)p_Var26 - (long)p_Var21) * 8);
                  lVar35 = CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                    local_2e8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_)
                  ;
                  ppiVar15 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_node;
                  ppiVar31 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_node;
                  piVar17 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur;
                  piVar22 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  piVar34 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_first;
                }
                uVar28 = uVar28 + 1;
                lVar25 = ((long)piVar22 - (long)piVar34 >> 2) +
                         ((((ulong)((long)ppiVar31 - (long)ppiVar15) >> 3) - 1) +
                         (ulong)(ppiVar31 == (_Map_pointer)0x0)) * 0x80;
                lVar38 = lVar35 - (long)piVar17 >> 2;
              } while (uVar28 < (lVar38 + lVar25) - 1U);
              lVar25 = lVar25 + lVar38;
            }
            uVar19 = (int)lVar25 - 1;
            if (-1 < (int)uVar19) {
              uVar28 = (ulong)uVar19;
              do {
                uVar37 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur -
                          (long)local_148._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                         uVar28;
                if ((long)uVar37 < 0) {
                  uVar20 = (long)uVar37 >> 7;
LAB_00120e17:
                  piVar16 = local_148._M_impl.super__Deque_impl_data._M_start._M_node[uVar20] +
                            uVar37 + uVar20 * -0x80;
                }
                else {
                  if (0x7f < uVar37) {
                    uVar20 = uVar37 >> 7;
                    goto LAB_00120e17;
                  }
                  piVar16 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur + uVar28;
                }
                if (((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset !=
                    0) {
                  iVar29 = *piVar16;
                  uVar37 = 0;
                  do {
                    iVar23 = (int)uVar37;
                    if ((((local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar37 >> 6 & 0x3ffffff] >> (uVar37 & 0x3f) & 1) == 0) &&
                        (*(int *)((long)local_208 + uVar37 * 4) == iVar29)) &&
                       (pmVar13 = std::
                                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_190,
                                               (key_type *)(uVar37 * 4 + (long)local_228)),
                       *pmVar13 == 0)) {
                      uVar20 = ((long)local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur -
                                CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_start._M_first.
                                         _4_4_,local_2e8._M_impl.super__Deque_impl_data._M_start.
                                               _M_first._0_4_) >> 2) + uVar28;
                      if ((long)uVar20 < 0) {
                        uVar30 = (long)uVar20 >> 7;
LAB_00120ed3:
                        piVar17 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_node[uVar30]
                                  + uVar20 + uVar30 * -0x80;
                      }
                      else {
                        if (0x7f < uVar20) {
                          uVar30 = uVar20 >> 7;
                          goto LAB_00120ed3;
                        }
                        piVar17 = local_2e8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar28;
                      }
                      piVar22 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (local_2e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_2e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        piVar22 = local_2e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                  0x80;
                      }
                      local_1d4.elements._M_elems[0] = *piVar17;
                      local_1d4.elements._M_elems[1] = piVar22[-1] + 1;
                      paVar14 = (edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      piVar16 = paVar14[uVar37]._M_elems + 2;
                      local_1d4.elements._M_elems._8_8_ = *(undefined8 *)piVar16;
                      local_1d4.elements._M_elems._16_8_ = *(undefined8 *)(piVar16 + 2);
                      piVar16 = paVar14[uVar37]._M_elems + 6;
                      uVar4 = *(undefined8 *)piVar16;
                      uVar9 = *(undefined8 *)(piVar16 + 2);
                      local_1d4.elements._M_elems[6] = (int)uVar4;
                      local_1d4.elements._M_elems[7] = (int)((ulong)uVar4 >> 0x20);
                      local_1d4.elements._M_elems[8] = (int)uVar9;
                      local_1d4.elements._M_elems[9] = (int)((ulong)uVar9 >> 0x20);
                      local_1d4.index = iVar23;
                      if (iStack_290._M_current == local_288) {
                        std::
                        vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                        ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                  ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                    *)&local_298,iStack_290,&local_1d4);
                      }
                      else {
                        *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 7) =
                             CONCAT44(local_1d4.elements._M_elems[8],local_1d4.elements._M_elems[7])
                        ;
                        *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 9) =
                             CONCAT44(iVar23,local_1d4.elements._M_elems[9]);
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 4) =
                             local_1d4.elements._M_elems._16_8_;
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 6) = uVar4;
                        *(ulong *)((iStack_290._M_current)->elements)._M_elems =
                             CONCAT44(local_1d4.elements._M_elems[1],local_1d4.elements._M_elems[0])
                        ;
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 2) =
                             local_1d4.elements._M_elems._8_8_;
                        iStack_290._M_current = iStack_290._M_current + 1;
                      }
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 < (ulong)local_260.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_offset +
                                    ((long)local_260.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_p -
                                    (long)local_260.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p) * 8);
                }
                bVar12 = 0 < (long)uVar28;
                uVar28 = uVar28 - 1;
              } while (bVar12);
            }
            __last._M_current = iStack_290._M_current;
            _Var40._M_current = local_298._M_current;
            if (local_298._M_current != iStack_290._M_current) {
              uVar28 = ((long)iStack_290._M_current - (long)local_298._M_current >> 2) *
                       0x2e8ba2e8ba2e8ba3;
              lVar38 = 0x3f;
              if (uVar28 != 0) {
                for (; uVar28 >> lVar38 == 0; lVar38 = lVar38 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (local_298,
                         (__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                          )iStack_290._M_current,(ulong)(((uint)lVar38 ^ 0x3f) * 2) ^ 0x7e,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x120365);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (_Var40,(__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                                 )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x120365);
            }
            paVar14 = local_160.
                      super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar36].
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_160.
                super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar36].
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish != paVar14) {
              local_160.
              super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar36].
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = paVar14;
            }
            piVar32 = local_1f0.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar36].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            if (local_1f0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar36].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish != piVar32) {
              local_1f0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar36].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = piVar32;
            }
            _Var40._M_current = local_298._M_current;
            if (iStack_290._M_current != local_298._M_current) {
              lVar38 = 0;
              uVar28 = 0;
              do {
                _Var40._M_current = local_298._M_current;
                if ((uVar28 != 0) &&
                   (bVar12 = is_pattern_edge_smaller_than
                                       ((array<int,_10UL> *)
                                        ((long)local_298._M_current[-1].elements._M_elems + lVar38),
                                        (array<int,_10UL> *)
                                        ((long)((local_298._M_current)->elements)._M_elems + lVar38)
                                        ,true), bVar12)) break;
                this = (vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                       (local_160.
                        super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar36);
                paVar39 = (array<int,_10UL> *)
                          ((long)((_Var40._M_current)->elements)._M_elems + lVar38);
                iVar6._M_current = *(array<int,_10UL> **)(this + 8);
                if (iVar6._M_current == *(array<int,_10UL> **)(this + 0x10)) {
                  std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                  _M_realloc_insert<std::array<int,10ul>const&>(this,iVar6,paVar39);
                }
                else {
                  *(undefined8 *)((iVar6._M_current)->_M_elems + 8) =
                       *(undefined8 *)(paVar39->_M_elems + 8);
                  uVar4 = *(undefined8 *)paVar39->_M_elems;
                  uVar9 = *(undefined8 *)(paVar39->_M_elems + 2);
                  uVar10 = *(undefined8 *)(paVar39->_M_elems + 6);
                  *(undefined8 *)((iVar6._M_current)->_M_elems + 4) =
                       *(undefined8 *)(paVar39->_M_elems + 4);
                  *(undefined8 *)((iVar6._M_current)->_M_elems + 6) = uVar10;
                  *(undefined8 *)(iVar6._M_current)->_M_elems = uVar4;
                  *(undefined8 *)((iVar6._M_current)->_M_elems + 2) = uVar9;
                  *(long *)(this + 8) = *(long *)(this + 8) + 0x28;
                }
                this_00 = (vector<int,std::allocator<int>> *)
                          (local_1f0.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar36);
                piVar16 = (int *)((long)(&(local_298._M_current)->elements + 1) + lVar38);
                __position_00._M_current = *(int **)(this_00 + 8);
                if (__position_00._M_current == *(int **)(this_00 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_00,__position_00,piVar16);
                }
                else {
                  *__position_00._M_current = *piVar16;
                  *(int **)(this_00 + 8) = __position_00._M_current + 1;
                }
                uVar28 = uVar28 + 1;
                lVar38 = lVar38 + 0x2c;
                _Var40._M_current = local_298._M_current;
              } while (uVar28 < (ulong)(((long)iStack_290._M_current - (long)local_298._M_current >>
                                        2) * 0x2e8ba2e8ba2e8ba3));
            }
            if (_Var40._M_current != (labeled_pattern_edge *)0x0) {
              operator_delete(_Var40._M_current);
            }
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_148);
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_2e8);
            iVar23 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar36];
          }
          local_1a0 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_230 = lVar36 * 3;
          paVar14 = local_160.
                    super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar36].
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_80 = local_160.
                     super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar37 = ((long)local_160.
                          super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar36].
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar14 >> 3) *
                   -0x3333333333333333;
          uVar28 = (ulong)iVar23;
          if (uVar28 <= uVar37 && uVar37 - uVar28 != 0) {
            paVar39 = (edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar36;
            piVar16 = paVar14[uVar28]._M_elems + 1;
            do {
              local_198 = uVar28 * 5;
              pattern_edge1 = paVar14 + uVar28;
              bVar12 = is_pattern_edge_smaller_than(pattern_edge1,paVar39,true);
              if (bVar12) {
                bVar12 = false;
                goto LAB_001215ed;
              }
              if (pattern_edge1->_M_elems[0] == paVar39->_M_elems[0]) {
                uVar20 = 0xffffffffffffffff;
                do {
                  if (uVar20 == 7) goto LAB_00121393;
                  lVar35 = uVar20 + 1;
                  uVar30 = uVar20 + 1;
                  lVar38 = uVar20 + 2;
                  uVar20 = uVar30;
                } while (piVar16[lVar35] == paVar39->_M_elems[lVar38]);
                if (7 < uVar30) {
LAB_00121393:
                  local_1a0[lVar36] = (int)uVar28 + 1;
                  if (local_278.
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      local_278.
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                    _M_realloc_insert<std::array<int,10ul>const&>
                              ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                               &local_278,
                               (iterator)
                               local_278.
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,pattern_edge1);
                    pvVar27 = local_160.
                              super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  else {
                    *(undefined8 *)
                     ((local_278.
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 8) =
                         *(undefined8 *)(pattern_edge1->_M_elems + 8);
                    uVar4 = *(undefined8 *)pattern_edge1->_M_elems;
                    uVar9 = *(undefined8 *)(pattern_edge1->_M_elems + 2);
                    uVar10 = *(undefined8 *)(pattern_edge1->_M_elems + 6);
                    *(undefined8 *)
                     ((local_278.
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) =
                         *(undefined8 *)(pattern_edge1->_M_elems + 4);
                    *(undefined8 *)
                     ((local_278.
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 6) = uVar10;
                    *(undefined8 *)
                     (local_278.
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_elems = uVar4;
                    *(undefined8 *)
                     ((local_278.
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 2) = uVar9;
                    local_278.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_278.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                    pvVar27 = local_80;
                  }
                  lVar38 = local_198;
                  mVar5 = (edge_list->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start
                          [local_1f0.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar36].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar28]]._M_elems[0];
                  pmVar13 = std::
                            map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                          *)&local_f0,
                                         (pvVar27[lVar36].
                                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                         local_198 * 2);
                  *pmVar13 = mVar5;
                  mVar5 = (edge_list->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start
                          [local_1f0.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar36].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar28]]._M_elems[1];
                  pmVar13 = std::
                            map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                          *)&local_f0,
                                         (local_160.
                                          super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar36].
                                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                         lVar38 * 2 + 1);
                  *pmVar13 = mVar5;
                  pmVar13 = std::
                            map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                          *)&local_190,
                                         (edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start
                                         [(&((local_1f0.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_start)[local_230][uVar28]].
                                         _M_elems);
                  *pmVar13 = *pmVar13 + 1;
                  pmVar13 = std::
                            map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                          *)&local_190,
                                         (edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start
                                         [(&((local_1f0.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_start)[local_230][uVar28]].
                                         _M_elems + 1);
                  *pmVar13 = *pmVar13 + 1;
                  iVar29 = (&((local_1f0.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start)[local_230][uVar28];
                  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar36] = iVar29;
                  iVar23 = iVar29 + 0x3f;
                  if (-1 < (long)iVar29) {
                    iVar23 = iVar29;
                  }
                  local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [(long)(iVar23 >> 6) +
                   ((ulong)(((long)iVar29 & local_238) < 0x8000000000000001) - 1)] =
                       local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(long)(iVar23 >> 6) +
                        ((ulong)(((long)iVar29 & local_238) < 0x8000000000000001) - 1)] |
                       1L << ((byte)iVar29 & 0x3f);
                  lVar36 = (long)(int)(iVar29 + uVar18) % (long)iVar11;
                  iVar23 = (int)lVar36;
                  iVar29 = iVar23 + 0x3f;
                  if (-1 < iVar23) {
                    iVar29 = iVar23;
                  }
                  local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [(long)(iVar29 >> 6) +
                   ((ulong)(((long)iVar23 & local_238) < 0x8000000000000001) - 1)] =
                       local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(long)(iVar29 >> 6) +
                        ((ulong)(((long)iVar23 & local_238) < 0x8000000000000001) - 1)] |
                       1L << ((byte)lVar36 & 0x3f);
                  iVar29 = local_27c + 1;
                  goto LAB_001215bf;
                }
              }
              uVar28 = uVar28 + 1;
              piVar16 = piVar16 + 10;
            } while (uVar28 <= uVar37 && uVar37 - uVar28 != 0);
          }
          local_1a0[lVar36] = 0;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_f0,
                                 local_278.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems);
          local_2e8._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               CONCAT44(local_2e8._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar13);
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_f0,
                                 local_278.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + 1);
          iVar29 = local_27c;
          local_148._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               CONCAT44(local_148._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar13);
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_190,(key_type *)&local_2e8);
          *pmVar13 = *pmVar13 + -1;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_190,(key_type *)&local_148);
          *pmVar13 = *pmVar13 + -1;
          local_278.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_278.
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
          iVar23 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar36];
          if ((long)iVar23 != 0xffffffffffffffff) {
            iVar24 = iVar23 + 0x3f;
            if (-1 < iVar23) {
              iVar24 = iVar23;
            }
            bVar8 = (byte)iVar23 & 0x3f;
            local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)(iVar24 >> 6) + ((ulong)(((long)iVar23 & local_238) < 0x8000000000000001) - 1)] =
                 local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar24 >> 6) +
                  ((ulong)(((long)iVar23 & local_238) < 0x8000000000000001) - 1)] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            lVar38 = (long)(int)(iVar23 + uVar18) % (long)iVar11;
            iVar24 = (int)lVar38;
            iVar23 = iVar24 + 0x3f;
            if (-1 < iVar24) {
              iVar23 = iVar24;
            }
            bVar8 = (byte)lVar38 & 0x3f;
            local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)(iVar23 >> 6) + ((ulong)(((long)iVar24 & local_238) < 0x8000000000000001) - 1)] =
                 local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar23 >> 6) +
                  ((ulong)(((long)iVar24 & local_238) < 0x8000000000000001) - 1)] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar36] = -1;
          }
          iVar29 = iVar29 + -1;
LAB_001215bf:
          iVar29 = iVar29 - (uint)((int)uVar18 <= iVar29);
        } while (iVar29 != 0);
      }
      bVar12 = true;
LAB_001215ed:
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_f0);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_190);
      if (local_228 != (void *)0x0) {
        operator_delete(local_228);
      }
      if (local_208 != (void *)0x0) {
        operator_delete(local_208);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_1f0);
      std::
      vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
      ::~vector(&local_160);
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_278.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      piVar32 = local_88 + 1;
    } while ((bVar12 & piVar32 != local_90) != 0);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool is_min_code(std::vector<std::array<int, 10>> edge_list, std::vector<std::array<int, 8>> starting_edges)
    {

        int n_edges = edge_list.size();
        for (int i = 0; i < n_edges; i++)
        {
            edge_list.push_back(flipPatternEdge(edge_list[i]));
        }

        int n_starting_edge = starting_edges.size();
        for (int i = 0; i < n_starting_edge; i++)
        {
            starting_edges.push_back(flipAdjacencyInfo(starting_edges[i]));
        }

        std::vector<int> indices_of_min_edges = find_minimum_labelings(edge_list, starting_edges, false);


        for (int min_edge_ind : indices_of_min_edges)
        {

            std::array<int, 10> built_min_code_edge = {0, 1, edge_list[min_edge_ind][2], edge_list[min_edge_ind][3],
                                                       edge_list[min_edge_ind][4],
                                                       edge_list[min_edge_ind][5], edge_list[min_edge_ind][6],
                                                       edge_list[min_edge_ind][7], edge_list[min_edge_ind][8],
                                                       edge_list[min_edge_ind][9]};

            if (is_pattern_edge_smaller_than(built_min_code_edge, edge_list[0], true))
            {
                return false;
            }

            std::vector<std::array<int, 10>> built_min_code;
            built_min_code.push_back(built_min_code_edge);


            std::vector<bool> selected_edges(2 * n_edges, false);
            std::vector<int> selected_edges_ind(n_edges, -1);

            std::vector<int> selected_candidates(n_edges,
                                                 0);  // which candidate was chosen for each edge (used for backtracking)
            // which candidates are possible for each edge (used for backtracking), we are not interested in the 1st element
            std::vector<std::vector<std::array<int, 10>>> all_edge_candidates(n_edges,
                                                                              std::vector<std::array<int, 10>>());
            std::vector<std::vector<int>> all_edge_candidates_selected_edges_ind(n_edges, std::vector<int>());

            selected_edges_ind[0] = min_edge_ind;
            selected_edges[min_edge_ind] = true;  // set the first edge as occupied
            selected_edges[(min_edge_ind + n_edges) %
                           (2 * n_edges)] = true;  // the reversed direction of the edge will be also occupied

            int current_index = 1;

            std::vector<int> src_vertices;
            std::vector<int> dst_vertices;

            // how many edges in built_min_code use the vertices?
            std::map<int, int> amount_of_usage_of_original_vertices;

            // here we keep the mapping of min_code ids to edge_list vertex ids:
            std::map<int, int> vertex_id_mapping;
            vertex_id_mapping[0] = edge_list[min_edge_ind][0];
            vertex_id_mapping[1] = edge_list[min_edge_ind][1];

            for (int i = 0; i < edge_list.size(); i++)
            {
                src_vertices.push_back(edge_list[i][0]);
                dst_vertices.push_back(edge_list[i][1]);
                // all nodes are used 0-times at first
                amount_of_usage_of_original_vertices[edge_list[i][0]] = 0;
                amount_of_usage_of_original_vertices[edge_list[i][1]] = 0;
            }

            // we occupied the first two nodes:
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][0]] = 1;
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][1]] = 1;

            // do DFS
            while (true)
            {
                if (current_index >= n_edges)
                {
                    current_index--;
                }
                if (current_index == 0)
                {
                    // (we have tried all posibilities from the current initial edge)
                    // we backtracked back to 0, we should start finding the minimum code from other position (break the repeat loop)
                    // (we couldn't find it here)
                    break;
                }

                // we just moved by one edge, find all candidates for growing the the pattern:
                if (selected_candidates[current_index] == 0)
                {
                    std::deque<int> right_most_path = find_rightmost_path(built_min_code);
                    std::deque<int> right_most_path_occurrence;
                    for (int i = 0; i < right_most_path.size(); i++)
                    {
                        right_most_path_occurrence.push_back(vertex_id_mapping[right_most_path[i]]);
                    }
                    int right_most_vertex = right_most_path_occurrence.back();

                    std::vector<labeled_pattern_edge> edge_candidates;

                    // find backward edge candidates:
                    int src = right_most_vertex;
                    for (int i = 0; i < right_most_path.size() - 1; i++)
                    {
                        int dst = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src && dst_vertices[j] == dst)
                            {
                                std::array<int, 10> e_cand = {right_most_path.back(), right_most_path[i],
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};
                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    // find forward edge candidates:
                    for (int i = right_most_path.size() - 1; i >= 0; i--)
                    {
                        src = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src &&
                                amount_of_usage_of_original_vertices[dst_vertices[j]] == 0)
                            {
                                std::array<int, 10> e_cand = {right_most_path[i], right_most_path.back() + 1,
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};
                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    std::sort(edge_candidates.begin(), edge_candidates.end(), cmp_labeled_pattern_edge);

                    all_edge_candidates[current_index].clear();
                    all_edge_candidates_selected_edges_ind[current_index].clear();
                    for (size_t i = 0; i < edge_candidates.size(); i++)
                    {
                        if (i > 0 &&
                            is_pattern_edge_smaller_than(edge_candidates[i - 1].elements, edge_candidates[i].elements,
                                                         true))
                        {
                            // don't take candidates that cannot have smaller code
                            break;
                        }
                        all_edge_candidates[current_index].push_back(edge_candidates[i].elements);
                        all_edge_candidates_selected_edges_ind[current_index].push_back(edge_candidates[i].index);
                    }
                }

                // try to use the candidates
                bool should_backtrack = true;
                for (int edge_candidate_ind = selected_candidates[current_index];
                     edge_candidate_ind < all_edge_candidates[current_index].size(); edge_candidate_ind++)
                {
                    bool is_smaller = is_pattern_edge_smaller_than(
                            all_edge_candidates[current_index][edge_candidate_ind], edge_list[current_index], true);

                    if (is_smaller)
                    {
                        return false;
                    }
                    if (is_pattern_edge_equal_to(all_edge_candidates[current_index][edge_candidate_ind],
                                                 edge_list[current_index], true))
                    {
                        // they are same, so append it and move to other edge
                        // NOTE: there can be several edges with the same code (if necessary, these must be tested later as well)
                        selected_candidates[current_index] = edge_candidate_ind + 1;
                        built_min_code.push_back(all_edge_candidates[current_index][edge_candidate_ind]);

                        vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][0]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0];
                        vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][1]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1];

                        amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0]] += 1;
                        amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1]] += 1;

                        int sel_e_ind = all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind];
                        selected_edges_ind[current_index] = sel_e_ind;
                        selected_edges[sel_e_ind] = true;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = true;

                        current_index++;
                        should_backtrack = false;
                        break;
                    }
                }

                // the candidate edge made larger code or we don't have more candidates to try:
                if (should_backtrack)
                {
                    selected_candidates[current_index] = 0;

                    // now we need to decrement the usage of these two vertices:
                    int decremented1 = vertex_id_mapping[built_min_code.back()[0]];
                    int decremented2 = vertex_id_mapping[built_min_code.back()[1]];
                    amount_of_usage_of_original_vertices[decremented1] -= 1;
                    amount_of_usage_of_original_vertices[decremented2] -= 1;

                    built_min_code.pop_back();

                    int sel_e_ind = selected_edges_ind[current_index];
                    if (sel_e_ind != -1)
                    {
                        selected_edges[sel_e_ind] = false;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = false;
                        selected_edges_ind[current_index] = -1;
                    }

                    current_index--;
                }
            }

        }

        // we could not find a smaller code
        return true;
    }